

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erase_if_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::EraseIf_FlatHashSet_uint32_Test::TestBody
          (EraseIf_FlatHashSet_uint32_Test *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<int> iVar1;
  initializer_list<int> iVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  key_equal *pkVar6;
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  int local_120 [4];
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  st2;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  size_t num_erased;
  allocator<unsigned_int> local_63;
  key_equal local_62;
  hasher local_61;
  int local_60 [4];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  st1;
  EraseIf_FlatHashSet_uint32_Test *this_local;
  
  local_60[0] = 3;
  local_60[1] = 6;
  local_60[2] = 7;
  local_60[3] = 9;
  local_50 = local_60;
  local_48 = 4;
  st1.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
        )(_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
          )this;
  std::allocator<unsigned_int>::allocator(&local_63);
  iVar2._M_len = local_48;
  iVar2._M_array = local_50;
  pkVar6 = &local_62;
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::raw_hash_set((flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_40,iVar2,0,&local_61,pkVar6,&local_63);
  std::allocator<unsigned_int>::~allocator(&local_63);
  sVar4 = erase_if<unsigned_int,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>,phmap::priv::(anonymous_namespace)::EraseIf_FlatHashSet_uint32_Test::TestBody()::__0>
                    (local_40);
  local_99 = sVar4 == 2;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar3) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &st2.
                super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                .settings_,(internal *)local_98,(AssertionResult *)"num_erased == 2","false","true",
               (char *)pkVar6);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0xe,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string
              ((string *)
               &st2.
                super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                .settings_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_120[0] = 0;
  local_120[1] = 2;
  local_120[2] = 3;
  local_120[3] = 6;
  local_110 = local_120;
  local_108 = 4;
  this_00 = (allocator<unsigned_int> *)
            ((long)&gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 5);
  std::allocator<unsigned_int>::allocator(this_00);
  iVar1._M_len = local_108;
  iVar1._M_array = local_110;
  pkVar6 = (key_equal *)
           ((long)&gtest_ar__1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 6);
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::raw_hash_set((flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_100,iVar1,0,
                 (hasher *)
                 ((long)&gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7),pkVar6,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 5));
  sVar4 = erase_if<unsigned_int,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>,phmap::priv::(anonymous_namespace)::EraseIf_FlatHashSet_uint32_Test::TestBody()::__1>
                    (local_100);
  local_139 = sVar4 == 2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar3) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_138,
               (AssertionResult *)"num_erased == 2","false","true",(char *)pkVar6);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0x12,pcVar5);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_181 = priv::operator==((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_40,
                               (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_100);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar3) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b8,(internal *)local_180,(AssertionResult *)"st1 == st2","false","true",
               (char *)pkVar6);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0x14,pcVar5);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~flat_hash_set((flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_100);
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~flat_hash_set((flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_40);
  return;
}

Assistant:

TEST(EraseIf, FlatHashSet_uint32) {
    phmap::flat_hash_set<uint32_t> st1 = { 3, 6, 7, 9 };
    auto num_erased = erase_if(st1, [](const uint32_t& v) { return v >= 7; });
    EXPECT_TRUE(num_erased == 2);

    phmap::flat_hash_set<uint32_t> st2 = { 0, 2, 3, 6 };
    num_erased = erase_if(st2, [](const uint32_t& v) { return v <= 2; });
    EXPECT_TRUE(num_erased == 2);

    EXPECT_TRUE(st1 == st2);
}